

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::FluxRegister::FineAdd
          (FluxRegister *this,FArrayBox *flux,int dir,int boxno,int srccomp,int destcomp,int numcomp
          ,Real mult,RunOn runon)

{
  bool bVar1;
  int in_EDX;
  long in_RSI;
  Real in_RDI;
  int in_stack_00000010;
  Box thibx;
  iterator __end3_1;
  iterator __begin3_1;
  range_impl<amrex::Box> *__range3_1;
  Box tlobx;
  iterator __end3;
  iterator __begin3;
  range_impl<amrex::Box> *__range3;
  Dim3 local_ratio;
  Array4<const_double> farr;
  Array4<double> hiarr;
  Array4<double> loarr;
  Box *hibox;
  Box *lobox;
  FArrayBox *hireg;
  FArrayBox *loreg;
  int in_stack_fffffffffffffa8c;
  range_impl<amrex::Box> *in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  Array4<const_double> *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffacc;
  Array4<double> *in_stack_fffffffffffffad0;
  Box *in_stack_fffffffffffffad8;
  iterator local_510;
  undefined1 local_4f8 [40];
  undefined1 *local_4d0;
  Box local_4c4;
  iterator local_4a8;
  iterator local_490;
  undefined1 local_478 [40];
  undefined1 *local_450;
  int local_448 [2];
  int local_440;
  undefined1 local_434 [92];
  int in_stack_fffffffffffffc28;
  Dim3 *in_stack_fffffffffffffc30;
  Array4<double> local_3a8;
  Box *local_368;
  Box *local_360;
  Orientation local_354;
  BaseFab<double> *local_350;
  Orientation local_344;
  BaseFab<double> *local_340;
  int local_324;
  long local_320;
  BaseFab<double> *local_310;
  BaseFab<double> *local_308;
  long local_300;
  int local_2f8 [2];
  int local_2f0;
  int *local_2e8;
  int local_2dc;
  undefined4 uStack_2d8;
  int local_2d4;
  Dim3 local_2d0;
  Dim3 local_2c0;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Dim3 local_270;
  Dim3 local_260;
  Dim3 local_250;
  int local_244;
  Box *local_240;
  double *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  Box *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  undefined4 local_1ec;
  Box *local_1e8;
  Dim3 local_1e0;
  Box *local_1d0;
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  undefined4 local_1bc;
  Box *local_1b8;
  undefined4 local_1ac;
  Box *local_1a8;
  undefined4 local_19c;
  Box *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  IntVect *local_168;
  undefined4 local_15c;
  IntVect *local_158;
  undefined4 local_14c;
  IntVect *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_324 = in_EDX;
  local_320 = in_RSI;
  Orientation::Orientation(&local_344,in_EDX,low);
  Orientation::operator_cast_to_int(&local_344);
  local_340 = &FabSet::operator[]((FabSet *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c)->
               super_BaseFab<double>;
  Orientation::Orientation(&local_354,local_324,high);
  Orientation::operator_cast_to_int(&local_354);
  local_350 = &FabSet::operator[]((FabSet *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c)->
               super_BaseFab<double>;
  local_360 = BaseFab<double>::box(local_340);
  local_368 = BaseFab<double>::box(local_350);
  local_308 = local_340;
  local_288 = local_340->dptr;
  local_290 = &local_340->domain;
  local_294 = local_340->nvar;
  local_19c = 0;
  local_1c8 = (local_290->smallend).vect[0];
  local_1ac = 1;
  iStack_1c4 = (local_340->domain).smallend.vect[1];
  local_2b0.x = (local_290->smallend).vect[0];
  local_2b0.y = (local_290->smallend).vect[1];
  local_1bc = 2;
  local_2b0.z = (local_340->domain).smallend.vect[2];
  local_f8 = &(local_340->domain).bigend;
  local_fc = 0;
  local_128 = local_f8->vect[0] + 1;
  local_108 = &(local_340->domain).bigend;
  local_10c = 1;
  iStack_124 = (local_340->domain).bigend.vect[1] + 1;
  local_118 = &(local_340->domain).bigend;
  local_11c = 2;
  local_2d0.z = (local_340->domain).bigend.vect[2] + 1;
  local_2d0.y = iStack_124;
  local_2d0.x = local_128;
  local_2c0._0_8_ = local_2d0._0_8_;
  local_2c0.z = local_2d0.z;
  local_2a0._0_8_ = local_2b0._0_8_;
  local_2a0.z = local_2b0.z;
  local_1e0._0_8_ = local_2b0._0_8_;
  local_1e0.z = local_2b0.z;
  local_1d0 = local_290;
  local_1c0 = local_2b0.z;
  local_1b8 = local_290;
  local_1a8 = local_290;
  local_198 = local_290;
  local_140._0_8_ = local_2d0._0_8_;
  local_140.z = local_2d0.z;
  local_130 = local_290;
  local_120 = local_2d0.z;
  Array4<double>::Array4(&local_3a8,local_288,&local_2a0,&local_2c0,local_294);
  local_310 = local_350;
  local_238 = local_350->dptr;
  local_240 = &local_350->domain;
  local_244 = local_350->nvar;
  local_1ec = 0;
  local_218 = (local_240->smallend).vect[0];
  local_1fc = 1;
  iStack_214 = (local_350->domain).smallend.vect[1];
  local_260.x = (local_240->smallend).vect[0];
  local_260.y = (local_240->smallend).vect[1];
  local_20c = 2;
  local_260.z = (local_350->domain).smallend.vect[2];
  local_148 = &(local_350->domain).bigend;
  local_14c = 0;
  local_178 = local_148->vect[0] + 1;
  local_158 = &(local_350->domain).bigend;
  local_15c = 1;
  iStack_174 = (local_350->domain).bigend.vect[1] + 1;
  local_168 = &(local_350->domain).bigend;
  local_16c = 2;
  local_280.z = (local_350->domain).bigend.vect[2] + 1;
  local_280.y = iStack_174;
  local_280.x = local_178;
  local_270._0_8_ = local_280._0_8_;
  local_270.z = local_280.z;
  local_250._0_8_ = local_260._0_8_;
  local_250.z = local_260.z;
  local_230._0_8_ = local_260._0_8_;
  local_230.z = local_260.z;
  local_220 = local_240;
  local_210 = local_260.z;
  local_208 = local_240;
  local_1f8 = local_240;
  local_1e8 = local_240;
  local_190._0_8_ = local_280._0_8_;
  local_190.z = local_280.z;
  local_180 = local_240;
  local_170 = local_280.z;
  Array4<double>::Array4
            ((Array4<double> *)(local_434 + 0x4c),local_238,&local_250,&local_270,local_244);
  local_300 = local_320;
  local_a8 = *(double **)(local_320 + 0x10);
  local_b0 = (undefined8 *)(local_320 + 0x18);
  local_b4 = *(int *)(local_320 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_320 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(local_320 + 0x20);
  local_8 = (int *)(local_320 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_320 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_320 + 0x28) + 1;
  local_28 = local_320 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(local_320 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4
            ((Array4<const_double> *)(local_434 + 0xc),local_a8,&local_c0,&local_e0,local_b4);
  local_2e8 = (int *)((long)in_RDI + 0x970);
  local_2dc = *local_2e8;
  uStack_2d8 = *(undefined4 *)((long)in_RDI + 0x974);
  local_448 = *(int (*) [2])local_2e8;
  local_440 = *(int *)((long)in_RDI + 0x978);
  local_434._0_8_ = local_448;
  local_434._8_4_ = local_440;
  local_2f8 = local_448;
  local_2f0 = local_440;
  local_2d4 = local_440;
  if ((in_stack_00000010 == 0) && (bVar1 = Gpu::inLaunchRegion(), bVar1)) {
    Gpu::Range<amrex::Box>(&in_stack_fffffffffffffa90->m_b);
    local_450 = local_478;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_fffffffffffffa90);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_fffffffffffffa90);
    while (bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_490,&local_4a8), bVar1) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_4c4,&local_490);
      in_stack_fffffffffffffa90 = (range_impl<amrex::Box> *)local_434;
      fluxreg_fineadd(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                      in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,
                      in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,in_RDI);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_490);
    }
    Gpu::Range<amrex::Box>(&in_stack_fffffffffffffa90->m_b);
    local_4d0 = local_4f8;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_fffffffffffffa90);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_fffffffffffffa90);
    while (bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_510,(iterator *)&stack0xfffffffffffffad8), bVar1) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                ((Box *)&stack0xfffffffffffffabc,&local_510);
      fluxreg_fineadd(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                      in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,
                      in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,in_RDI);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_510);
    }
  }
  else {
    fluxreg_fineadd(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                    in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,
                    in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,in_RDI);
    fluxreg_fineadd(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                    in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,
                    in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,in_RDI);
  }
  return;
}

Assistant:

void
FluxRegister::FineAdd (const FArrayBox& flux,
                       int              dir,
                       int              boxno,
                       int              srccomp,
                       int              destcomp,
                       int              numcomp,
                       Real             mult,
                       RunOn            runon) noexcept
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= flux.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    const Box& lobox = loreg.box();
    const Box& hibox = hireg.box();

    Array4<Real> loarr = loreg.array();
    Array4<Real> hiarr = hireg.array();
    Array4<Real const> farr = flux.const_array();
    const Dim3 local_ratio = ratio.dim3();

    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion())
    {
        AMREX_LAUNCH_DEVICE_LAMBDA
        ( lobox, tlobx,
          {
              fluxreg_fineadd(tlobx, loarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          },
          hibox, thibx,
          {
              fluxreg_fineadd(thibx, hiarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          }
        );
    }
    else
    {
        fluxreg_fineadd(lobox, loarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
        fluxreg_fineadd(hibox, hiarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
    }
}